

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O2

void saveFaces(Mat *img,Mat *img_gray)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  string saveName;
  stringstream buffer;
  _Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_300;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [3];
  Mat local_218 [96];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  cv::Mat::Mat(local_218,img_gray);
  detectFaces((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_300,local_218);
  cv::Mat::~Mat(local_218);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_300._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_300._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar2 = uVar2 + 1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::operator+(local_278,"smile",&local_2c8);
    std::operator+(&local_298,local_278,".png");
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&local_2c8);
    puVar1 = (undefined8 *)((long)&(local_300._M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    local_2a8 = *puVar1;
    uStack_2a0 = puVar1[1];
    cv::Mat::Mat((Mat *)local_278,img,(Rect_ *)&local_2a8);
    local_2c8.field_2._M_allocated_capacity = 0;
    local_2c8._M_dataplus._M_p._0_4_ = 0x1010000;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d8 = 0;
    local_2c8._M_string_length = (size_type)local_278;
    cv::imwrite((string *)&local_298,(_InputArray *)&local_2c8,(vector *)&local_2e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2e8);
    cv::Mat::~Mat((Mat *)local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    lVar3 = lVar3 + 0x10;
  }
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base(&local_300);
  return;
}

Assistant:

void saveFaces(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    stringstream buffer;
    buffer << i;
    string saveName = "smile" + buffer.str() + ".png";
    Rect roi = faces[i];
    imwrite(saveName, img(roi));
  }
}